

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdoptpfor.h
# Opt level: O0

uint32_t __thiscall
FastPForLib::SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_>::findBestB
          (SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t len)

{
  uint32_t uVar1;
  reference pvVar2;
  ulong uVar3;
  size_type sVar4;
  uint **in_RDI;
  uint32_t in_stack_00000014;
  uint32_t csize;
  uint32_t i;
  uint32_t in_stack_00000024;
  uint32_t mb;
  uint32_t bsize;
  uint32_t b;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint32_t uVar5;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar6;
  uint local_1c;
  uint32_t local_18;
  
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  local_18 = *pvVar2;
  local_1c = tryB(_mb,in_stack_00000024,_csize,in_stack_00000014);
  uVar1 = maxbits<unsigned_int_const*>
                    ((uint **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
  uVar6 = 0;
  while (uVar5 = uVar1,
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            SIMDNewPFor<4u,FastPForLib::Simple16<false>>::possLogs,(ulong)uVar6),
        *pvVar2 + 0x1c < uVar5) {
    uVar6 = uVar6 + 1;
  }
  for (; uVar3 = (ulong)uVar6,
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         SIMDNewPFor<4u,FastPForLib::Simple16<false>>::possLogs), uVar3 < sVar4 - 1;
      uVar6 = uVar6 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               SIMDNewPFor<4u,FastPForLib::Simple16<false>>::possLogs,(ulong)uVar6);
    uVar1 = tryB(_mb,in_stack_00000024,_csize,in_stack_00000014);
    if (uVar1 <= local_1c) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          SIMDNewPFor<4u,FastPForLib::Simple16<false>>::possLogs,(ulong)uVar6);
      local_18 = *pvVar2;
      local_1c = uVar1;
    }
  }
  return local_18;
}

Assistant:

__attribute__((pure)) uint32_t
SIMDOPTPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::findBestB(
    const uint32_t *in, uint32_t len) {
  uint32_t b =
      SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs.back();
  assert(b == 32);
  uint32_t bsize = tryB(b, in, len);
  const uint32_t mb = maxbits(in, in + len);
  uint32_t i = 0;
  while (
      mb >
      28 + SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs[i])
    ++i; // some schemes such as Simple16 don't code numbers greater than 28

  for (; i < SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs
                     .size() -
                 1;
       i++) {
    const uint32_t csize = tryB(
        SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs[i],
        in, len);

    if (csize <= bsize) {
      b = SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::possLogs[i];
      bsize = csize;
    }
  }
  return b;
}